

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject ** getgclist(GCObject *o)

{
  Udata *u;
  GCObject *o_local;
  
  switch(o->tt) {
  case '\x05':
    o_local = o + 3;
    break;
  case '\x06':
    o_local = o + 1;
    break;
  case '\a':
    o_local = o + 2;
    break;
  case '\b':
    o_local = (GCObject *)&o[4].tt;
    break;
  default:
    o_local = (GCObject *)0x0;
    break;
  case '\n':
    o_local = (GCObject *)&o[7].tt;
    break;
  case '&':
    o_local = o + 1;
  }
  return &o_local->next;
}

Assistant:

static GCObject **getgclist (GCObject *o) {
  switch (o->tt) {
    case LUA_VTABLE: return &gco2t(o)->gclist;
    case LUA_VLCL: return &gco2lcl(o)->gclist;
    case LUA_VCCL: return &gco2ccl(o)->gclist;
    case LUA_VTHREAD: return &gco2th(o)->gclist;
    case LUA_VPROTO: return &gco2p(o)->gclist;
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      lua_assert(u->nuvalue > 0);
      return &u->gclist;
    }
    default: lua_assert(0); return 0;
  }
}